

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

void SetConversation(int convid,PClassActor *Class,int dlgindex)

{
  int iVar1;
  int *piVar2;
  FName local_20;
  int local_1c;
  PClassActor *pPStack_18;
  int dlgindex_local;
  PClassActor *Class_local;
  int convid_local;
  
  local_1c = dlgindex;
  pPStack_18 = Class;
  Class_local._4_4_ = convid;
  if (convid != -1) {
    piVar2 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::operator[](&DialogueRoots,convid)
    ;
    *piVar2 = dlgindex;
  }
  iVar1 = local_1c;
  if (pPStack_18 != (PClassActor *)0x0) {
    FName::FName(&local_20,&(pPStack_18->super_PClass).super_PStruct.super_PNamedType.TypeName);
    piVar2 = TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator[]
                       (&ClassRoots,&local_20);
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

void SetConversation(int convid, PClassActor *Class, int dlgindex)
{
	if (convid != -1)
	{
		DialogueRoots[convid] = dlgindex;
	}
	if (Class != NULL)
	{
		ClassRoots[Class->TypeName] = dlgindex;
	}
}